

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.util.c
# Opt level: O1

void pnga_print_file(FILE *file,Integer g_a)

{
  long lVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Integer ndim;
  Integer type;
  Integer lo [7];
  Integer dims [7];
  long local_a8;
  Integer local_a0;
  Integer local_98 [8];
  Integer local_58 [8];
  
  pnga_inquire(g_a,&local_a0,&local_a8,local_58);
  if (0 < local_a8) {
    lVar1 = local_a8 + -1;
    auVar3._8_4_ = (int)lVar1;
    auVar3._0_8_ = lVar1;
    auVar3._12_4_ = (int)((ulong)lVar1 >> 0x20);
    uVar2 = 0;
    auVar3 = auVar3 ^ _DAT_001b1870;
    auVar4 = _DAT_001b1890;
    do {
      auVar5 = auVar4 ^ _DAT_001b1870;
      if ((bool)(~(auVar5._4_4_ == auVar3._4_4_ && auVar3._0_4_ < auVar5._0_4_ ||
                  auVar3._4_4_ < auVar5._4_4_) & 1)) {
        local_98[uVar2] = 1;
      }
      if ((auVar5._12_4_ != auVar3._12_4_ || auVar5._8_4_ <= auVar3._8_4_) &&
          auVar5._12_4_ <= auVar3._12_4_) {
        local_98[uVar2 + 1] = 1;
      }
      uVar2 = uVar2 + 2;
      lVar1 = auVar4._8_8_;
      auVar4._0_8_ = auVar4._0_8_ + 2;
      auVar4._8_8_ = lVar1 + 2;
    } while ((local_a8 + 1U & 0xfffffffffffffffe) != uVar2);
  }
  pnga_print_patch_file(file,g_a,local_98,local_58,1);
  return;
}

Assistant:

void pnga_print_file(FILE *file, Integer g_a)
{
    Integer i;
    Integer type, ndim, dims[MAXDIM];
    Integer lo[MAXDIM];
    Integer pretty = 1;

    pnga_inquire(g_a, &type, &ndim, dims);

    for(i=0; i<ndim; i++) lo[i] = 1;

    pnga_print_patch_file(file, g_a, lo, dims, pretty);
}